

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcap.c
# Opt level: O0

int pcap_activate(pcap_t *p)

{
  int iVar1;
  char *pcVar2;
  int status;
  pcap_t *p_local;
  
  iVar1 = pcap_check_activated(p);
  if (iVar1 == 0) {
    p_local._4_4_ = (*p->activate_op)(p);
    if (p_local._4_4_ < 0) {
      if (p->errbuf[0] == '\0') {
        pcVar2 = pcap_statustostr(p_local._4_4_);
        snprintf(p->errbuf,0x100,"%s",pcVar2);
      }
      initialize_ops(p);
    }
    else {
      p->activated = 1;
    }
  }
  else {
    p_local._4_4_ = -4;
  }
  return p_local._4_4_;
}

Assistant:

int
pcap_activate(pcap_t *p)
{
	int status;

	/*
	 * Catch attempts to re-activate an already-activated
	 * pcap_t; this should, for example, catch code that
	 * calls pcap_open_live() followed by pcap_activate(),
	 * as some code that showed up in a Stack Exchange
	 * question did.
	 */
	if (pcap_check_activated(p))
		return (PCAP_ERROR_ACTIVATED);
	status = p->activate_op(p);
	if (status >= 0)
		p->activated = 1;
	else {
		if (p->errbuf[0] == '\0') {
			/*
			 * No error message supplied by the activate routine;
			 * for the benefit of programs that don't specially
			 * handle errors other than PCAP_ERROR, return the
			 * error message corresponding to the status.
			 */
			pcap_snprintf(p->errbuf, PCAP_ERRBUF_SIZE, "%s",
			    pcap_statustostr(status));
		}

		/*
		 * Undo any operation pointer setting, etc. done by
		 * the activate operation.
		 */
		initialize_ops(p);
	}
	return (status);
}